

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

ssize_t __thiscall
icu_63::StringTrieBuilder::ListBranchNode::write
          (ListBranchNode *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  int iVar4;
  ssize_t sVar5;
  int32_t *piVar6;
  undefined4 in_register_00000034;
  long *plVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,__fd);
  lVar8 = (long)this->length;
  pNVar2 = this->equal[lVar8 + -1];
  piVar6 = &pNVar2->offset;
  if (pNVar2 == (Node *)0x0) {
    piVar6 = &(this->super_BranchNode).firstEdgeNumber;
  }
  iVar4 = *piVar6;
  do {
    pNVar3 = this->equal[lVar8 + -2];
    if (((pNVar3 != (Node *)0x0) && (iVar1 = pNVar3->offset, iVar1 < 0)) &&
       ((iVar1 < iVar4 || ((this->super_BranchNode).firstEdgeNumber < iVar1)))) {
      (*(pNVar3->super_UObject)._vptr_UObject[5])(pNVar3,plVar7);
    }
    lVar8 = lVar8 + -1;
  } while (1 < lVar8);
  iVar4 = this->length;
  if (pNVar2 == (Node *)0x0) {
    (**(code **)(*plVar7 + 0x88))(plVar7,this->values[(long)iVar4 + -1],1);
  }
  else {
    (*(pNVar2->super_UObject)._vptr_UObject[5])(pNVar2,plVar7);
  }
  sVar5 = (**(code **)(*plVar7 + 0x78))(plVar7,this->units[iVar4 + -1]);
  (this->super_BranchNode).super_Node.offset = (int32_t)sVar5;
  if (1 < iVar4) {
    lVar8 = (ulong)(iVar4 - 2) + 0x2c;
    do {
      lVar9 = *(long *)((long)this + lVar8 * 8 + -0x148);
      if (lVar9 == 0) {
        iVar4 = *(int *)((long)this + lVar8 * 4 + -0x6c);
      }
      else {
        iVar4 = (int)sVar5 - *(int *)(lVar9 + 0xc);
      }
      (**(code **)(*plVar7 + 0x88))(plVar7,iVar4,lVar9 == 0);
      sVar5 = (**(code **)(*plVar7 + 0x78))
                        (plVar7,*(undefined2 *)((long)this->equal + lVar8 * 2 + -0x18));
      (this->super_BranchNode).super_Node.offset = (int32_t)sVar5;
      lVar9 = lVar8 + -0x2c;
      bVar10 = lVar8 != 0x2c;
      lVar8 = lVar8 + -1;
    } while (bVar10 && -1 < lVar9);
  }
  return sVar5;
}

Assistant:

void
StringTrieBuilder::ListBranchNode::write(StringTrieBuilder &builder) {
    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t unitNumber=length-1;
    Node *rightEdge=equal[unitNumber];
    int32_t rightEdgeNumber= rightEdge==NULL ? firstEdgeNumber : rightEdge->getOffset();
    do {
        --unitNumber;
        if(equal[unitNumber]!=NULL) {
            equal[unitNumber]->writeUnlessInsideRightEdge(firstEdgeNumber, rightEdgeNumber, builder);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    if(rightEdge==NULL) {
        builder.writeValueAndFinal(values[unitNumber], TRUE);
    } else {
        rightEdge->write(builder);
    }
    offset=builder.write(units[unitNumber]);
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        int32_t value;
        UBool isFinal;
        if(equal[unitNumber]==NULL) {
            // Write the final value for the one string ending with this unit.
            value=values[unitNumber];
            isFinal=TRUE;
        } else {
            // Write the delta to the start position of the sub-node.
            U_ASSERT(equal[unitNumber]->getOffset()>0);
            value=offset-equal[unitNumber]->getOffset();
            isFinal=FALSE;
        }
        builder.writeValueAndFinal(value, isFinal);
        offset=builder.write(units[unitNumber]);
    }
}